

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

ParseLocation * __thiscall
embree::FileStream::location(ParseLocation *__return_storage_ptr__,FileStream *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ssize_t sVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  peVar1 = (this->name).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (this->name).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->fileName).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->fileName).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar2 = this->colNumber;
    __return_storage_ptr__->lineNumber = this->lineNumber;
    __return_storage_ptr__->colNumber = sVar2;
    return __return_storage_ptr__;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar3 = __libc_single_threaded == '\0';
    uVar4 = (undefined4)this->lineNumber;
    uVar5 = *(undefined4 *)((long)&this->lineNumber + 4);
    uVar6 = (undefined4)this->colNumber;
    uVar7 = *(undefined4 *)((long)&this->colNumber + 4);
    (__return_storage_ptr__->fileName).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->fileName).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
    if (bVar3) {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      goto LAB_001308fe;
    }
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    uVar4 = (undefined4)this->lineNumber;
    uVar5 = *(undefined4 *)((long)&this->lineNumber + 4);
    uVar6 = (undefined4)this->colNumber;
    uVar7 = *(undefined4 *)((long)&this->colNumber + 4);
    (__return_storage_ptr__->fileName).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->fileName).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
  }
  this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_001308fe:
  *(undefined4 *)&__return_storage_ptr__->lineNumber = uVar4;
  *(undefined4 *)((long)&__return_storage_ptr__->lineNumber + 4) = uVar5;
  *(undefined4 *)&__return_storage_ptr__->colNumber = uVar6;
  *(undefined4 *)((long)&__return_storage_ptr__->colNumber + 4) = uVar7;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return __return_storage_ptr__;
}

Assistant:

ParseLocation location() {
      return ParseLocation(name,lineNumber,colNumber,charNumber);
    }